

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBridge.c
# Opt level: O0

DdNode * ddBddToAddRecur(DdManager *dd,DdNode *B)

{
  DdNode *T_00;
  DdNode *E_00;
  DdNode *f;
  bool bVar1;
  DdNode *pDStack_58;
  int complement;
  DdNode *Be;
  DdNode *Bt;
  DdNode *E;
  DdNode *T;
  DdNode *res1;
  DdNode *res;
  DdNode *one;
  DdNode *B_local;
  DdManager *dd_local;
  
  res1 = dd->one;
  if (*(int *)((ulong)B & 0xfffffffffffffffe) == 0x7fffffff) {
    if (B != res1) {
      res1 = dd->zero;
    }
    dd_local = (DdManager *)res1;
  }
  else {
    dd_local = (DdManager *)cuddCacheLookup1(dd,ddBddToAddRecur,B);
    if (dd_local == (DdManager *)0x0) {
      bVar1 = ((ulong)B & 1) == 0;
      if (bVar1) {
        Be = (B->type).kids.T;
        pDStack_58 = (B->type).kids.E;
      }
      else {
        Be = *(DdNode **)(((ulong)B & 0xfffffffffffffffe) + 0x10);
        pDStack_58 = *(DdNode **)(((ulong)B & 0xfffffffffffffffe) + 0x18);
      }
      T_00 = ddBddToAddRecur(dd,Be);
      if (T_00 == (DdNode *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) + 1;
        E_00 = ddBddToAddRecur(dd,pDStack_58);
        if (E_00 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,T_00);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) + 1;
          f = cuddUniqueInter(dd,*(int *)((ulong)B & 0xfffffffffffffffe),T_00,E_00);
          if (f == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,T_00);
            Cudd_RecursiveDeref(dd,E_00);
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) + -1;
            *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) + -1;
            res1 = f;
            if (!bVar1) {
              *(int *)(((ulong)f & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)f & 0xfffffffffffffffe) + 4) + 1;
              res1 = cuddAddCmplRecur(dd,f);
              if (res1 == (DdNode *)0x0) {
                Cudd_RecursiveDeref(dd,f);
                return (DdNode *)0x0;
              }
              *(int *)(((ulong)res1 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)res1 & 0xfffffffffffffffe) + 4) + 1;
              Cudd_RecursiveDeref(dd,f);
              *(int *)(((ulong)res1 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)res1 & 0xfffffffffffffffe) + 4) + -1;
            }
            cuddCacheInsert1(dd,ddBddToAddRecur,B,res1);
            dd_local = (DdManager *)res1;
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

static DdNode *
ddBddToAddRecur(
  DdManager * dd,
  DdNode * B)
{
    DdNode *one;
    DdNode *res, *res1, *T, *E, *Bt, *Be;
    int complement = 0;

    statLine(dd);
    one = DD_ONE(dd);

    if (Cudd_IsConstant(B)) {
        if (B == one) {
            res = one;
        } else {
            res = DD_ZERO(dd);
        }
        return(res);
    }
    /* Check visited table */
    res = cuddCacheLookup1(dd,ddBddToAddRecur,B);
    if (res != NULL) return(res);

    if (Cudd_IsComplement(B)) {
        complement = 1;
        Bt = cuddT(Cudd_Regular(B));
        Be = cuddE(Cudd_Regular(B));
    } else {
        Bt = cuddT(B);
        Be = cuddE(B);
    }

    T = ddBddToAddRecur(dd, Bt);
    if (T == NULL) return(NULL);
    cuddRef(T);

    E = ddBddToAddRecur(dd, Be);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd, T);
        return(NULL);
    }
    cuddRef(E);

    /* No need to check for T == E, because it is guaranteed not to happen. */
    res = cuddUniqueInter(dd, (int) Cudd_Regular(B)->index, T, E);
    if (res == NULL) {
        Cudd_RecursiveDeref(dd ,T);
        Cudd_RecursiveDeref(dd ,E);
        return(NULL);
    }
    cuddDeref(T);
    cuddDeref(E);

    if (complement) {
        cuddRef(res);
        res1 = cuddAddCmplRecur(dd, res);
        if (res1 == NULL) {
            Cudd_RecursiveDeref(dd, res);
            return(NULL);
        }
        cuddRef(res1);
        Cudd_RecursiveDeref(dd, res);
        res = res1;
        cuddDeref(res);
    }

    /* Store result. */
    cuddCacheInsert1(dd,ddBddToAddRecur,B,res);

    return(res);

}